

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

void mcpl_write_buffer(FILE *f,uint32_t n,char *data,char *errmsg)

{
  size_t sVar1;
  ulong __n;
  uint local_24;
  
  local_24 = n;
  sVar1 = fwrite(&local_24,1,4,(FILE *)f);
  if (sVar1 == 4) {
    __n = (ulong)local_24;
    sVar1 = fwrite(data,1,__n,(FILE *)f);
    if (sVar1 == __n) {
      return;
    }
  }
  (*mcpl_error_handler)(errmsg);
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

MCPL_LOCAL void mcpl_write_buffer(FILE* f, uint32_t n, const char * data, const char * errmsg)
{
  size_t nb = fwrite(&n, 1, sizeof(n), f);
  if (nb!=sizeof(n))
    mcpl_error(errmsg);
  nb = fwrite(data, 1, n, f);
  if (nb!=n)
    mcpl_error(errmsg);
}